

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  double a;
  int iVar1;
  DataArray<int> *pDVar2;
  DataArray<int> *pDVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  fpclass_type fVar9;
  long lVar10;
  int *piVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  soplex *psVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  long lVar17;
  Item *pIVar18;
  long in_FS_OFFSET;
  byte bVar19;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_130;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar19 = 0;
  pDVar2 = this->m_activeColscaleExp;
  pDVar3 = this->m_activeRowscaleExp;
  pIVar18 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,a);
  if (0 < (pIVar18->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    iVar1 = pDVar2->data[i];
    lVar17 = 0x80;
    lVar10 = 0;
    do {
      piVar7 = (int *)((long)&(((pIVar18->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data + lVar17);
      iVar6 = pDVar3->data[*piVar7];
      piVar11 = piVar7 + -0x20;
      psVar14 = local_b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(int *)psVar14 = *piVar11;
        piVar11 = piVar11 + (ulong)bVar19 * -2 + 1;
        psVar14 = psVar14 + (ulong)bVar19 * -8 + 4;
      }
      local_40 = piVar7[-4];
      local_3c = (undefined1)piVar7[-3];
      local_38 = *(undefined8 *)(piVar7 + -2);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_130,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)-(iVar6 + iVar1),CONCAT31((int3)((uint)local_40 >> 8),local_3c));
      uVar4 = local_130.m_backend._120_8_;
      local_1b0.exp = local_130.m_backend.exp;
      fVar9 = local_130.m_backend.fpclass;
      local_1b0.neg = local_130.m_backend.neg;
      if (local_130.m_backend.neg == true) {
        local_1b0.neg = fVar9 == cpp_dec_float_finite && local_130.m_backend.data._M_elems[0] == 0;
      }
      local_1b0.data._M_elems[0] = local_130.m_backend.data._M_elems[0];
      puVar12 = local_130.m_backend.data._M_elems + 1;
      puVar15 = local_1b0.data._M_elems + 1;
      for (lVar8 = 0x1b; uVar5 = local_130.m_backend._120_8_, lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar15 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      local_130.m_backend.fpclass = (fpclass_type)uVar4;
      local_130.m_backend.prec_elem = SUB84(uVar4,4);
      local_1b0.fpclass = local_130.m_backend.fpclass;
      local_1b0.prec_elem = local_130.m_backend.prec_elem;
      local_130.m_backend._120_8_ = uVar5;
      if (((fVar9 != cpp_dec_float_NaN) &&
          ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_1b0,&__return_storage_ptr__->m_backend), iVar6 < 0)) {
        pcVar13 = &local_1b0;
        pnVar16 = __return_storage_ptr__;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        (__return_storage_ptr__->m_backend).exp = local_1b0.exp;
        (__return_storage_ptr__->m_backend).neg = local_1b0.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_1b0.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_1b0.prec_elem;
      }
      lVar10 = lVar10 + 1;
      lVar17 = lVar17 + 0x84;
    } while (lVar10 < (pIVar18->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getColMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nCols());
   assert(i >= 0);

   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& colVec = lp.LPColSetBase<R>::colVector(i);

   R min = R(infinity);
   int exp1;
   int exp2 = colscaleExp[i];

   for(int j = 0; j < colVec.size(); j++)
   {
      exp1 = rowscaleExp[colVec.index(j)];
      R abs = spxAbs(spxLdexp(colVec.value(j), -exp1 - exp2));

      if(abs < min)
         min = abs;
   }

   return min;
}